

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_helper.c
# Opt level: O0

int nghttp2_increase_local_window_size
              (int32_t *param_1,int32_t *recv_window_size_ptr,int32_t *recv_reduction_ptr,
              int32_t *delta_ptr)

{
  int local_3c;
  int32_t delta;
  int32_t recv_reduction_delta;
  int32_t *delta_ptr_local;
  int32_t *recv_reduction_ptr_local;
  int32_t *recv_window_size_ptr_local;
  int32_t *local_window_size_ptr_local;
  
  local_3c = *delta_ptr;
  if (local_3c < 0) {
    __assert_fail("delta >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_helper.c"
                  ,0xe1,
                  "int nghttp2_increase_local_window_size(int32_t *, int32_t *, int32_t *, int32_t *)"
                 );
  }
  if (0x7fffffff - local_3c < *param_1) {
    local_window_size_ptr_local._4_4_ = -0x20c;
  }
  else {
    *param_1 = local_3c + *param_1;
    if (*recv_reduction_ptr < local_3c) {
      local_3c = *recv_reduction_ptr;
    }
    *recv_reduction_ptr = *recv_reduction_ptr - local_3c;
    *recv_window_size_ptr = local_3c + *recv_window_size_ptr;
    *delta_ptr = *delta_ptr - local_3c;
    local_window_size_ptr_local._4_4_ = 0;
  }
  return local_window_size_ptr_local._4_4_;
}

Assistant:

int nghttp2_increase_local_window_size(int32_t *local_window_size_ptr,
                                       int32_t *recv_window_size_ptr,
                                       int32_t *recv_reduction_ptr,
                                       int32_t *delta_ptr) {
  int32_t recv_reduction_delta;
  int32_t delta;

  delta = *delta_ptr;

  assert(delta >= 0);

  /* The delta size is strictly more than received bytes. Increase
     local_window_size by that difference |delta|. */
  if (*local_window_size_ptr > NGHTTP2_MAX_WINDOW_SIZE - delta) {
    return NGHTTP2_ERR_FLOW_CONTROL;
  }

  *local_window_size_ptr += delta;
  /* If there is recv_reduction due to earlier window_size
     reduction, we have to adjust it too. */
  recv_reduction_delta = nghttp2_min(*recv_reduction_ptr, delta);
  *recv_reduction_ptr -= recv_reduction_delta;

  *recv_window_size_ptr += recv_reduction_delta;

  /* recv_reduction_delta must be paid from *delta_ptr, since it was
     added in window size reduction (see below). */
  *delta_ptr -= recv_reduction_delta;

  return 0;
}